

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaAllocation_T::InitDedicatedAllocation
          (VmaAllocation_T *this,VmaPool hParentPool,uint32_t memoryTypeIndex,VkDeviceMemory hMemory
          ,VmaSuballocationType suballocationType,void *pMappedData,VkDeviceSize size)

{
  this->m_Type = '\x02';
  this->m_Alignment = 0;
  this->m_Size = size;
  this->m_MemoryTypeIndex = memoryTypeIndex;
  this->m_SuballocationType = (uint8_t)suballocationType;
  if (pMappedData != (void *)0x0) {
    this->m_Flags = this->m_Flags | 1;
  }
  (this->field_0).m_DedicatedAllocation.m_hParentPool = hParentPool;
  (this->field_0).m_DedicatedAllocation.m_hMemory = hMemory;
  (this->field_0).m_DedicatedAllocation.m_pMappedData = pMappedData;
  (this->field_0).m_DedicatedAllocation.m_Prev = (VmaAllocation_T *)0x0;
  (this->field_0).m_DedicatedAllocation.m_Next = (VmaAllocation_T *)0x0;
  return;
}

Assistant:

void VmaAllocation_T::InitDedicatedAllocation(
    VmaPool hParentPool,
    uint32_t memoryTypeIndex,
    VkDeviceMemory hMemory,
    VmaSuballocationType suballocationType,
    void* pMappedData,
    VkDeviceSize size)
{
    VMA_ASSERT(m_Type == ALLOCATION_TYPE_NONE);
    VMA_ASSERT(hMemory != VK_NULL_HANDLE);
    m_Type = (uint8_t)ALLOCATION_TYPE_DEDICATED;
    m_Alignment = 0;
    m_Size = size;
    m_MemoryTypeIndex = memoryTypeIndex;
    m_SuballocationType = (uint8_t)suballocationType;
    if(pMappedData != VMA_NULL)
    {
        VMA_ASSERT(IsMappingAllowed() && "Mapping is not allowed on this allocation! Please use one of the new VMA_ALLOCATION_CREATE_HOST_ACCESS_* flags when creating it.");
        m_Flags |= (uint8_t)FLAG_PERSISTENT_MAP;
    }
    m_DedicatedAllocation.m_hParentPool = hParentPool;
    m_DedicatedAllocation.m_hMemory = hMemory;
    m_DedicatedAllocation.m_pMappedData = pMappedData;
    m_DedicatedAllocation.m_Prev = VMA_NULL;
    m_DedicatedAllocation.m_Next = VMA_NULL;
}